

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O0

char * jsonnet_realloc(JsonnetVm *vm,char *str,size_t sz)

{
  size_t in_RDX;
  void *in_RSI;
  char *r_1;
  char *r;
  undefined8 local_8;
  
  if (in_RSI == (void *)0x0) {
    if (in_RDX == 0) {
      local_8 = (char *)0x0;
    }
    else {
      local_8 = (char *)malloc(in_RDX);
      if (local_8 == (char *)0x0) {
        memory_panic();
      }
    }
  }
  else if (in_RDX == 0) {
    free(in_RSI);
    local_8 = (char *)0x0;
  }
  else {
    local_8 = (char *)realloc(in_RSI,in_RDX);
    if (local_8 == (char *)0x0) {
      memory_panic();
    }
  }
  return local_8;
}

Assistant:

char *jsonnet_realloc(JsonnetVm *vm, char *str, size_t sz)
{
    (void)vm;
    if (str == nullptr) {
        if (sz == 0)
            return nullptr;
        auto *r = static_cast<char *>(::malloc(sz));
        if (r == nullptr)
            memory_panic();
        return r;
    } else {
        if (sz == 0) {
            ::free(str);
            return nullptr;
        } else {
            auto *r = static_cast<char *>(::realloc(str, sz));
            if (r == nullptr)
                memory_panic();
            return r;
        }
    }
}